

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_TestShell::
~TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_TestShell
          (TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_TestShell *this)

{
  TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_TestShell *this_local;
  
  ~TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterTraced)
{
    MyTypeForTesting actualObject(676789);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);
    mock().tracing(true);

    mock().actualCall("someFunc").withOutputParameterOfType("MyTypeForTesting", "someParameter", &actualObject);

    mock().checkExpectations();
    STRCMP_CONTAINS("Function name:someFunc MyTypeForTesting someParameter:", mock().getTraceOutput());

    mock().removeAllComparatorsAndCopiers();
}